

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

char * __thiscall
sentencepiece::NBestSentencePieceText::_InternalParse
          (NBestSentencePieceText *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  void *pvVar1;
  uint tag_00;
  bool bVar2;
  SentencePieceText *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  uint32 tag;
  char *local_40;
  uint local_34;
  
  this_00 = &(this->super_MessageLite)._internal_metadata_;
  local_40 = ptr;
  do {
    while( true ) {
      bVar2 = google::protobuf::internal::ParseContext::Done(ctx,&local_40);
      if (bVar2) {
        return local_40;
      }
      local_40 = google::protobuf::internal::ReadTag(local_40,&local_34,0);
      tag_00 = local_34;
      if (local_40 == (char *)0x0) {
        return (char *)0x0;
      }
      if (local_34 != 10) break;
      local_40 = local_40 + -1;
      do {
        local_40 = local_40 + 1;
        msg = google::protobuf::RepeatedPtrField<sentencepiece::SentencePieceText>::Add
                        (&this->nbests_);
        local_40 = google::protobuf::internal::ParseContext::
                   ParseMessage<sentencepiece::SentencePieceText>(ctx,msg,local_40);
        if (local_40 == (char *)0x0) {
          return (char *)0x0;
        }
      } while ((local_40 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_40 == '\n'));
    }
    if ((local_34 == 0) || ((local_34 & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_34 - 1;
      return local_40;
    }
    pvVar1 = this_00->ptr_;
    if (((ulong)pvVar1 & 1) == 0) {
      unknown = google::protobuf::internal::InternalMetadata::
                mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
    }
    else {
      unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (((ulong)pvVar1 & 0xfffffffffffffffe) + 8);
    }
    local_40 = google::protobuf::internal::UnknownFieldParse(tag_00,unknown,local_40,ctx);
  } while (local_40 != (char *)0x0);
  return (char *)0x0;
}

Assistant:

const char* NBestSentencePieceText::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // repeated .sentencepiece.SentencePieceText nbests = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_nbests(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<10>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<std::string>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}